

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

CTcToken * __thiscall CTcTokenizer::copycur(CTcTokenizer *this)

{
  char *pcVar1;
  size_t len;
  char *__dest;
  int iVar2;
  
  iVar2 = is_tok_safe(this,(this->curtok_).typ_);
  if (iVar2 == 0) {
    pcVar1 = (this->curtok_).text_;
    len = (this->curtok_).text_len_;
    reserve_source(this,len);
    __dest = this->src_ptr_;
    memcpy(__dest,pcVar1,len);
    pcVar1 = this->src_ptr_;
    this->src_ptr_ = pcVar1 + len;
    this->src_rem_ = this->src_rem_ - len;
    pcVar1[len] = '\0';
    this->src_ptr_ = this->src_ptr_ + 1;
    this->src_rem_ = this->src_rem_ - 1;
    (this->curtok_).text_ = __dest;
  }
  return &this->curtok_;
}

Assistant:

const CTcToken *CTcTokenizer::copycur()
{
    /* if it's already a type that we store safely, return the current token */
    if (is_tok_safe(curtok_.gettyp()))
        return getcur();

    /* save the current token's text in permanent tokenizer memory */
    curtok_.set_text(store_source(curtok_.get_text(), curtok_.get_text_len()),
                     curtok_.get_text_len());

    /* return the current token, now that we've made it safe */
    return &curtok_;
}